

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrElse.cpp
# Opt level: O1

void __thiscall FactoredQLastTimeStepOrElse::Initialize(FactoredQLastTimeStepOrElse *this)

{
  long lVar1;
  size_t sVar2;
  value_type *__x;
  ulong uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"FactoredQLastTimeStepOrElse::Initialize()",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  lVar1 = (**(code **)(*(long *)&this->super_QFunctionForFactoredDecPOMDP + 0x78))
                    (&this->super_QFunctionForFactoredDecPOMDP);
  sVar2 = (**(code **)(**(long **)(lVar1 + 0x338) + 0xf8))();
  this->_m_nrLRFs = sVar2;
  std::vector<Scope,_std::allocator<Scope>_>::_M_erase_at_end
            (&this->_m_agentScopes,
             (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (this->_m_nrLRFs != 0) {
    uVar3 = 0;
    do {
      lVar1 = (**(code **)(*(long *)&this->super_QFunctionForFactoredDecPOMDP + 0x78))
                        (&this->super_QFunctionForFactoredDecPOMDP);
      __x = (value_type *)
            (**(code **)(**(long **)(lVar1 + 0x338) + 0x108))(*(long **)(lVar1 + 0x338),uVar3);
      std::vector<Scope,_std::allocator<Scope>_>::push_back(&this->_m_agentScopes,__x);
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (this->_m_nrLRFs != uVar3);
  }
  this->_m_initialized = true;
  return;
}

Assistant:

void FactoredQLastTimeStepOrElse::Initialize()
{
    cout << "FactoredQLastTimeStepOrElse::Initialize()"<<endl;
    _m_nrLRFs=GetPUF()->GetFDPOMDPD()->GetNrLRFs();
    _m_agentScopes.clear();
    for(Index e=0;e!=_m_nrLRFs;++e)
        _m_agentScopes.push_back(GetPUF()->GetFDPOMDPD()->GetAgentScopeForLRF(e));
    _m_initialized = true;
}